

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O2

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  long lVar23;
  void *pvVar24;
  void *pvVar25;
  int k;
  long lVar26;
  uint *puVar27;
  undefined4 uVar28;
  void *pvVar29;
  void *pvVar30;
  undefined2 *puVar31;
  void *pvVar32;
  void *pvVar33;
  long lVar34;
  int i;
  long lVar35;
  long lVar36;
  void *pvVar37;
  undefined2 *puVar38;
  undefined2 *puVar39;
  int q_1;
  void *pvVar40;
  void *pvVar41;
  undefined2 *puVar42;
  int k_1;
  ulong uVar43;
  void *pvVar44;
  void *pvVar45;
  void *local_100;
  undefined1 local_b8 [64];
  size_t local_78;
  long local_68;
  undefined8 local_60;
  short tmp [6] [3];
  
  local_78 = 0;
  local_b8._0_8_ = (void *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 0;
  local_b8._16_8_ = 0;
  local_b8._24_4_ = 0;
  local_b8._32_8_ = (Allocator *)0x0;
  local_b8._40_4_ = 0;
  local_b8._44_4_ = 0;
  local_b8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar43 = 0;
  Mat::create((Mat *)local_b8,0x24,inch,outch,2,(Allocator *)0x0);
  uVar19 = 0;
  if (0 < inch) {
    uVar19 = (ulong)(uint)inch;
  }
  uVar20 = 0;
  if (0 < outch) {
    uVar20 = (ulong)(uint)outch;
  }
  for (; uVar43 != uVar20; uVar43 = uVar43 + 1) {
    iVar18 = inch * 9 * (int)uVar43;
    pvVar45 = kernel->data;
    pvVar37 = (void *)(local_b8._16_8_ * local_78 * uVar43 + local_b8._0_8_);
    for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
      lVar35 = uVar21 * 9;
      cVar1 = *(char *)((long)pvVar45 + lVar35 + iVar18);
      cVar2 = *(char *)((long)pvVar45 + lVar35 + (long)iVar18 + 1);
      cVar3 = *(char *)((long)pvVar45 + lVar35 + (long)iVar18 + 2);
      cVar4 = *(char *)((long)pvVar45 + lVar35 + (long)iVar18 + 3);
      cVar5 = *(char *)((long)pvVar45 + lVar35 + (long)iVar18 + 4);
      cVar6 = *(char *)((long)pvVar45 + lVar35 + (long)iVar18 + 5);
      cVar7 = *(char *)((long)pvVar45 + lVar35 + (long)iVar18 + 6);
      cVar8 = *(char *)((long)pvVar45 + lVar35 + (long)iVar18 + 7);
      cVar9 = *(char *)((long)pvVar45 + lVar35 + (long)iVar18 + 8);
      for (lVar35 = 4; lVar35 != 0x28; lVar35 = lVar35 + 6) {
        sVar10 = *(short *)(&UNK_004c8c4c + lVar35);
        sVar11 = *(short *)(&UNK_004c8c4e + lVar35);
        sVar12 = *(short *)((long)&DAT_004c8c50 + lVar35);
        *(short *)((long)tmp[-1] + lVar35 + 2) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
        *(short *)((long)tmp[-1] + lVar35 + 4) = sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
        *(short *)((long)tmp[0] + lVar35) = sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
      }
      pvVar22 = pvVar37;
      for (lVar35 = 0; lVar35 != 6; lVar35 = lVar35 + 1) {
        sVar10 = tmp[lVar35][0];
        uVar13 = *(uint *)(tmp[lVar35] + 1);
        puVar27 = &DAT_004c8c52;
        for (lVar36 = 0; lVar36 != 6; lVar36 = lVar36 + 1) {
          auVar16 = vpmullw_avx(ZEXT416(*puVar27),ZEXT416(uVar13));
          uVar28 = vpextrw_avx(auVar16,1);
          *(short *)((long)pvVar22 + lVar36 * 2) =
               (short)uVar28 + auVar16._0_2_ + *(short *)((long)puVar27 + -2) * sVar10;
          puVar27 = (uint *)((long)puVar27 + 6);
        }
        pvVar22 = (void *)((long)pvVar22 + 0xc);
      }
      pvVar37 = (void *)((long)pvVar37 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
    }
  }
  Mat::create(kernel_tm,inch,0x24,(outch / 4) * -3 + outch,8,4,(Allocator *)0x0);
  lVar36 = local_78 * local_b8._16_8_;
  iVar18 = kernel_tm->w;
  pvVar37 = kernel_tm->data;
  sVar14 = kernel_tm->elemsize;
  local_60 = kernel_tm->cstep * sVar14;
  local_100 = (void *)(lVar36 * 3 + local_b8._0_8_);
  local_68 = lVar36 * 4;
  lVar35 = (long)(int)local_b8._44_4_ * local_b8._16_8_ * 8;
  pvVar45 = (void *)(local_b8._0_8_ + lVar36 * 2);
  pvVar29 = (void *)(lVar36 + local_b8._0_8_);
  pvVar22 = (void *)local_b8._0_8_;
  for (uVar19 = 0; (long)(uVar19 | 3) < (long)outch; uVar19 = uVar19 + 4) {
    pvVar24 = pvVar22;
    pvVar25 = local_100;
    pvVar33 = pvVar29;
    pvVar44 = pvVar45;
    for (lVar36 = 0; lVar36 != 0x24; lVar36 = lVar36 + 1) {
      lVar34 = (long)pvVar37 + (long)iVar18 * sVar14 * lVar36 + (uVar19 >> 2) * local_60;
      pvVar30 = pvVar24;
      pvVar32 = pvVar33;
      pvVar40 = pvVar44;
      pvVar41 = pvVar25;
      for (uVar43 = 0; (long)(uVar43 | 7) < (long)inch; uVar43 = uVar43 + 8) {
        lVar23 = 0;
        for (lVar26 = 0; lVar26 != 0x40; lVar26 = lVar26 + 8) {
          *(undefined2 *)(lVar34 + lVar26) = *(undefined2 *)((long)pvVar30 + lVar23);
          *(undefined2 *)(lVar34 + lVar26 + 2) = *(undefined2 *)((long)pvVar32 + lVar23);
          *(undefined2 *)(lVar34 + lVar26 + 4) = *(undefined2 *)((long)pvVar40 + lVar23);
          *(undefined2 *)(lVar34 + lVar26 + 6) = *(undefined2 *)((long)pvVar41 + lVar23);
          lVar23 = lVar23 + (long)(int)local_b8._44_4_ * local_b8._16_8_;
        }
        pvVar41 = (void *)((long)pvVar41 + lVar35);
        pvVar40 = (void *)((long)pvVar40 + lVar35);
        pvVar32 = (void *)((long)pvVar32 + lVar35);
        pvVar30 = (void *)((long)pvVar30 + lVar35);
        lVar34 = lVar34 + 0x40;
      }
      pvVar25 = (void *)((long)pvVar25 + 2);
      pvVar44 = (void *)((long)pvVar44 + 2);
      pvVar33 = (void *)((long)pvVar33 + 2);
      pvVar24 = (void *)((long)pvVar24 + 2);
    }
    local_100 = (void *)((long)local_100 + local_68);
    pvVar45 = (void *)((long)pvVar45 + local_68);
    pvVar29 = (void *)((long)pvVar29 + local_68);
    pvVar22 = (void *)((long)pvVar22 + local_68);
  }
  iVar18 = kernel_tm->w;
  pvVar45 = kernel_tm->data;
  sVar14 = kernel_tm->elemsize;
  sVar15 = kernel_tm->cstep;
  puVar31 = (undefined2 *)(local_b8._16_8_ * local_78 * uVar19 + local_b8._0_8_);
  for (; (long)uVar19 < (long)outch; uVar19 = uVar19 + 1) {
    puVar38 = puVar31;
    for (lVar35 = 0; lVar35 != 0x24; lVar35 = lVar35 + 1) {
      lVar36 = (long)pvVar45 +
               (long)iVar18 * sVar14 * lVar35 +
               (ulong)(((uint)uVar19 & 3) + ((uint)(uVar19 >> 2) & 0x3fffffff)) * sVar15 * sVar14;
      puVar42 = puVar38;
      for (uVar43 = 0; (long)(uVar43 | 7) < (long)inch; uVar43 = uVar43 + 8) {
        puVar39 = puVar42;
        for (lVar34 = 0; lVar34 != 0x10; lVar34 = lVar34 + 2) {
          *(undefined2 *)(lVar36 + lVar34) = *puVar39;
          puVar39 = (undefined2 *)((long)puVar39 + (long)(int)local_b8._44_4_ * local_b8._16_8_);
        }
        puVar42 = puVar42 + (long)(int)local_b8._44_4_ * local_b8._16_8_ * 4;
        lVar36 = lVar36 + 0x10;
      }
      puVar38 = puVar38 + 1;
    }
    puVar31 = (undefined2 *)((long)puVar31 + local_b8._16_8_ * local_78);
  }
  piVar17 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
        free((void *)local_b8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_b8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(kernel, kernel_tm, inch, outch, opt);
}